

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_gamemtls_lib.cxx
# Opt level: O1

bool __thiscall xray_re::xr_gamemtls_lib::load(xr_gamemtls_lib *this,string *path)

{
  int iVar1;
  xr_reader *r;
  
  if (xr_file_system::instance()::instance0 == '\0') {
    iVar1 = __cxa_guard_acquire(&xr_file_system::instance()::instance0);
    if (iVar1 != 0) {
      xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
      __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,
                   &__dso_handle);
      __cxa_guard_release(&xr_file_system::instance()::instance0);
    }
  }
  r = xr_file_system::r_open(&xr_file_system::instance::instance0,(path->_M_dataplus)._M_p);
  if (r != (xr_reader *)0x0) {
    load(this,r);
    (*r->_vptr_xr_reader[1])(r);
  }
  return r != (xr_reader *)0x0;
}

Assistant:

bool xr_gamemtls_lib::load(const std::string& path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;
	load(*r);
	fs.r_close(r);
	return true;
}